

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstructionFolder::IsFoldableVectorType
          (InstructionFolder *this,Instruction *type_inst)

{
  IRContext *this_00;
  uint32_t uVar1;
  Instruction *this_01;
  bool bVar2;
  
  if (type_inst->opcode_ != OpTypeVector) {
    return false;
  }
  uVar1 = (type_inst->has_result_id_ & 1) + 1;
  if (type_inst->has_type_id_ == false) {
    uVar1 = (uint)type_inst->has_result_id_;
  }
  uVar1 = Instruction::GetSingleWordOperand(type_inst,uVar1);
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar1);
  if (this_01 == (Instruction *)0x0) {
    bVar2 = false;
  }
  else if (this_01->opcode_ == OpTypeInt) {
    uVar1 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar1 = (uint)this_01->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(this_01,uVar1);
    bVar2 = uVar1 == 0x20;
  }
  else {
    bVar2 = this_01->opcode_ == OpTypeBool;
  }
  return bVar2;
}

Assistant:

bool InstructionFolder::IsFoldableVectorType(Instruction* type_inst) const {
  // Support vectors with foldable components
  if (type_inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_type_id = type_inst->GetSingleWordInOperand(0);
    Instruction* def_component_type =
        context_->get_def_use_mgr()->GetDef(component_type_id);
    return def_component_type != nullptr &&
           IsFoldableScalarType(def_component_type);
  }
  // Nothing else yet.
  return false;
}